

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_worker_cleanup(void)

{
  int iVar1;
  fio_defer_task_s task;
  fio_defer_task_s task_00;
  uint uVar2;
  __pid_t _Var3;
  fio_data_s *pfVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  if (fio_data->is_worker == '\0') {
    if (3 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("INFO: Server Detected exit signal.");
    }
  }
  else if (3 < FIO_LOG_LEVEL) {
    uVar2 = getpid();
    FIO_LOG2STDERR("INFO: (%d) detected exit signal.",(ulong)uVar2);
  }
  fio_state_callback_force(FIO_CALL_ON_SHUTDOWN);
  uVar6 = 0xffffffffffffffff;
  lVar7 = 0x6d;
  lVar5 = 0;
  pfVar4 = fio_data;
  do {
    if (*(long *)((long)pfVar4 + lVar7 + -0x15) != 0) {
      task.arg1 = (void *)((ulong)*(byte *)((long)&(pfVar4->last_cycle).tv_sec + lVar7) + lVar5);
      task.func = deferred_on_shutdown;
      task.arg2 = (void *)0x0;
      fio_defer_push_task_fn(task,&task_queue_normal);
      pfVar4 = fio_data;
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x100;
    lVar7 = lVar7 + 0xa8;
  } while (uVar6 < pfVar4->max_protocol_fd);
  task_00.arg2 = (void *)0x0;
  task_00.func = fio_cycle_unwind;
  task_00.arg1 = (void *)0x0;
  fio_defer_push_task_fn(task_00,&task_queue_normal);
  fio_defer_perform();
  uVar6 = 0xffffffffffffffff;
  lVar5 = 0x6f;
  lVar7 = 0;
  pfVar4 = fio_data;
  do {
    if ((*(long *)((long)pfVar4 + lVar5 + -0x17) != 0) ||
       (*(char *)((long)&(pfVar4->last_cycle).tv_sec + lVar5) != '\0')) {
      fio_force_close((ulong)*(byte *)((long)pfVar4 + lVar5 + -2) + lVar7);
      pfVar4 = fio_data;
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x100;
    lVar5 = lVar5 + 0xa8;
  } while (uVar6 < pfVar4->max_protocol_fd);
  fio_timer_clear_all();
  fio_defer_perform();
  if (fio_data->is_worker == '\0') {
    fio_cluster_signal_children();
    fio_defer_perform();
    do {
      _Var3 = wait((void *)0x0);
    } while (_Var3 != -1);
  }
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_ON_FINISH);
  fio_defer_perform();
  fio_signal_handler_reset();
  iVar1 = fio_data->parent;
  _Var3 = getpid();
  if (iVar1 == _Var3) {
    if (3 < FIO_LOG_LEVEL) {
      FIO_LOG2STDERR("INFO:    ---  Shutdown Complete  ---\n");
      return;
    }
  }
  else if (3 < FIO_LOG_LEVEL) {
    uVar2 = getpid();
    FIO_LOG2STDERR("INFO: (%d) cleanup complete.",(ulong)uVar2);
    return;
  }
  return;
}

Assistant:

static void fio_worker_cleanup(void) {
  /* switch to winding down */
  if (fio_data->is_worker)
    FIO_LOG_INFO("(%d) detected exit signal.", (int)getpid());
  else
    FIO_LOG_INFO("Server Detected exit signal.");
  fio_state_callback_force(FIO_CALL_ON_SHUTDOWN);
  for (size_t i = 0; i <= fio_data->max_protocol_fd; ++i) {
    if (fd_data(i).protocol) {
      fio_defer_push_task(deferred_on_shutdown, (void *)fd2uuid(i), NULL);
    }
  }
  fio_defer_push_task(fio_cycle_unwind, NULL, NULL);
  fio_defer_perform();
  for (size_t i = 0; i <= fio_data->max_protocol_fd; ++i) {
    if (fd_data(i).protocol || fd_data(i).open) {
      fio_force_close(fd2uuid(i));
    }
  }
  fio_timer_clear_all();
  fio_defer_perform();
  if (!fio_data->is_worker) {
    fio_cluster_signal_children();
    fio_defer_perform();
    while (wait(NULL) != -1)
      ;
  }
  fio_defer_perform();
  fio_state_callback_force(FIO_CALL_ON_FINISH);
  fio_defer_perform();
  fio_signal_handler_reset();
  if (fio_data->parent == getpid()) {
    FIO_LOG_INFO("   ---  Shutdown Complete  ---\n");
  } else {
    FIO_LOG_INFO("(%d) cleanup complete.", (int)getpid());
  }
}